

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O1

spv_result_t
spvtools::val::StructuredSwitchChecks
          (ValidationState_t *_,Function *function,Instruction *switch_inst,BasicBlock *header,
          BasicBlock *merge)

{
  __node_base_ptr p_Var1;
  ValidationState_t *pVVar2;
  BasicBlock *pBVar3;
  bool bVar4;
  uint uVar5;
  _Rb_tree_color _Var6;
  _Rb_tree_color _Var7;
  spv_result_t sVar8;
  uint uVar9;
  _Rb_tree_color _Var10;
  ulong uVar11;
  __node_base_ptr p_Var12;
  _Hash_node_base *p_Var13;
  BasicBlock *other;
  _Link_type p_Var14;
  ulong uVar15;
  Instruction *inst;
  _Base_ptr p_Var16;
  uint uVar17;
  size_t index;
  const_iterator __pos;
  __node_base_ptr p_Var18;
  int iVar19;
  bool bVar20;
  bool bVar21;
  pair<spvtools::val::BasicBlock_*,_bool> pVar22;
  uint32_t case_fall_through;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  num_fall_through_targeted;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  seen_to_fall_through;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  case_targets;
  spv_result_t local_31c;
  _Rb_tree_color local_318;
  uint local_314;
  ValidationState_t *local_310;
  string local_308;
  BasicBlock *local_2e8;
  BasicBlock *local_2e0;
  Function *local_2d8;
  ulong local_2d0;
  string local_2c8;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_2a8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_278;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_240;
  DiagnosticStream local_208;
  
  local_240._M_buckets = &local_240._M_single_bucket;
  local_240._M_bucket_count = 1;
  local_240._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_240._M_element_count = 0;
  local_240._M_rehash_policy._M_max_load_factor = 1.0;
  local_240._M_rehash_policy._M_next_resize = 0;
  local_240._M_single_bucket = (__node_base_ptr)0x0;
  local_310 = _;
  local_2e8 = header;
  local_2e0 = merge;
  local_2d8 = function;
  if (0x10 < (ulong)((long)(switch_inst->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(switch_inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    index = 1;
    uVar17 = 3;
    do {
      uVar5 = Instruction::GetOperandAs<unsigned_int>(switch_inst,index);
      local_278._M_buckets = (__buckets_ptr)CONCAT44(local_278._M_buckets._4_4_,uVar5);
      if (uVar5 != local_2e0->id_) {
        local_208._0_8_ = &local_240;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_240,&local_278,&local_208);
      }
      index = (size_t)uVar17;
      uVar17 = uVar17 + 2;
    } while (index < (ulong)((long)(switch_inst->operands_).
                                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(switch_inst->operands_).
                                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8._M_impl.super__Rb_tree_header._M_header;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  _Var6 = Instruction::GetOperandAs<unsigned_int>(switch_inst,1);
  bVar20 = 0x30 < (ulong)((long)(switch_inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(switch_inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_start);
  if ((bVar20) && (_Var7 = Instruction::GetOperandAs<unsigned_int>(switch_inst,3), _Var6 != _Var7))
  {
    uVar17 = 5;
    do {
      uVar15 = (ulong)uVar17;
      uVar11 = (long)(switch_inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(switch_inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      bVar20 = uVar15 < uVar11;
      if (uVar11 <= uVar15) break;
      _Var7 = Instruction::GetOperandAs<unsigned_int>(switch_inst,uVar15);
      uVar17 = uVar17 + 2;
    } while (_Var6 != _Var7);
  }
  local_278._M_buckets = &local_278._M_single_bucket;
  local_278._M_bucket_count = 1;
  local_278._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_278._M_element_count = 0;
  local_278._M_rehash_policy._M_max_load_factor = 1.0;
  local_278._M_rehash_policy._M_next_resize = 0;
  local_278._M_single_bucket = (__node_base_ptr)0x0;
  bVar21 = 0x10 < (ulong)((long)(switch_inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(switch_inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_start);
  if (bVar21) {
    local_2d0 = 0;
    uVar11 = 1;
    local_314 = 3;
    do {
      uVar17 = Instruction::GetOperandAs<unsigned_int>(switch_inst,uVar11);
      iVar19 = 10;
      if (uVar17 != local_2e0->id_) {
        local_318 = _S_red;
        p_Var1 = local_278._M_buckets[(ulong)uVar17 % local_278._M_bucket_count];
        p_Var12 = (__node_base_ptr)0x0;
        if ((p_Var1 != (__node_base_ptr)0x0) &&
           (p_Var12 = p_Var1, p_Var18 = p_Var1->_M_nxt, uVar17 != *(uint *)&p_Var1->_M_nxt[1]._M_nxt
           )) {
          while (p_Var13 = p_Var18->_M_nxt, p_Var13 != (_Hash_node_base *)0x0) {
            p_Var12 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var13[1]._M_nxt % local_278._M_bucket_count !=
                 (ulong)uVar17 % local_278._M_bucket_count) ||
               (p_Var12 = p_Var18, p_Var18 = p_Var13, uVar17 == *(uint *)&p_Var13[1]._M_nxt))
            goto LAB_001c37b2;
          }
          p_Var12 = (__node_base_ptr)0x0;
        }
LAB_001c37b2:
        if (p_Var12 == (__node_base_ptr)0x0) {
          p_Var13 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var13 = p_Var12->_M_nxt;
        }
        if (p_Var13 == (_Hash_node_base *)0x0) {
          pVar22 = Function::GetBlock(local_2d8,uVar17);
          other = pVar22.first;
          if (((local_2e8->structurally_reachable_ != true) ||
              (other->structurally_reachable_ != true)) ||
             (bVar4 = BasicBlock::structurally_dominates(local_2e8,other), pBVar3 = local_2e8,
             pVVar2 = local_310, bVar4)) {
            sVar8 = FindCaseFallThrough(local_310,other,&local_318,local_2e0,
                                        (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                         *)&local_240,local_2d8);
            _Var7 = local_318;
            if (sVar8 == SPV_SUCCESS) {
              if ((ulong)local_318 != 0) {
                __pos._M_node = &local_2a8._M_impl.super__Rb_tree_header._M_header;
                for (p_Var14 = (_Link_type)
                               local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent;
                    p_Var14 != (_Link_type)0x0;
                    p_Var14 = *(_Link_type *)
                               ((long)&p_Var14->_M_storage + (ulong)bVar4 * 8 + 0xfffffffffffffff0))
                {
                  bVar4 = ((_Base_ptr)&p_Var14->_M_storage)->_M_color < local_318;
                  if (!bVar4) {
                    __pos._M_node = &p_Var14->super__Rb_tree_node_base;
                  }
                }
                if (((_Rb_tree_header *)__pos._M_node == &local_2a8._M_impl.super__Rb_tree_header)
                   || (__pos._M_node[1]._M_color != local_318)) {
                  local_208._0_8_ = (ulong)local_318 | 0x100000000;
                  std::
                  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                  ::_M_emplace_hint_unique<std::pair<unsigned_int,int>>
                            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                              *)&local_2a8,__pos,(pair<unsigned_int,_int> *)&local_208);
                }
                else {
                  *(int *)&__pos._M_node[1].field_0x4 = *(int *)&__pos._M_node[1].field_0x4 + 1;
                }
              }
              local_208._4_4_ = _Var7;
              local_208._0_4_ = uVar17;
              std::
              _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_int,unsigned_int>>
                        ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&local_278,&local_208);
              bVar4 = true;
            }
            else {
              bVar4 = false;
              local_31c = sVar8;
            }
          }
          else {
            ValidationState_t::diag(&local_208,local_310,SPV_ERROR_INVALID_CFG,local_2e8->label_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"Switch header ",0xe);
            ValidationState_t::getIdName_abi_cxx11_(&local_308,pVVar2,pBVar3->id_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_308._M_dataplus._M_p,local_308._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208," does not structurally dominate its case construct ",
                       0x33);
            ValidationState_t::getIdName_abi_cxx11_(&local_2c8,pVVar2,uVar17);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
            local_31c = local_208.error_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
              operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_308._M_dataplus._M_p != &local_308.field_2) {
              operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1
                             );
            }
            DiagnosticStream::~DiagnosticStream(&local_208);
            bVar4 = false;
          }
          iVar19 = 1;
          if (!bVar4) goto LAB_001c3a0e;
        }
        else {
          local_318 = *(_Rb_tree_color *)((long)&p_Var13[1]._M_nxt + 4);
        }
        _Var7 = (_Rb_tree_color)local_2d0;
        if (local_318 != _Var6) {
          _Var7 = local_318;
        }
        if (bVar20) {
          _Var7 = local_318;
        }
        iVar19 = 0;
        local_318 = _Var7;
        if (_Var7 != _S_red) {
          uVar5 = local_314;
          if ((int)uVar11 == 1) {
            local_2d0 = (ulong)_Var7;
          }
          else {
            do {
              uVar15 = (ulong)uVar5;
              if ((ulong)((long)(switch_inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(switch_inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar15) break;
              uVar9 = Instruction::GetOperandAs<unsigned_int>(switch_inst,uVar15);
              uVar5 = uVar5 + 2;
            } while (uVar17 == uVar9);
            if (((ulong)((long)(switch_inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(switch_inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) < uVar15) ||
               (_Var10 = Instruction::GetOperandAs<unsigned_int>(switch_inst,uVar15), iVar19 = 0,
               _Var7 != _Var10)) {
              pVVar2 = local_310;
              ValidationState_t::diag(&local_208,local_310,SPV_ERROR_INVALID_CFG,switch_inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Case construct that targets ",0x1c);
              ValidationState_t::getIdName_abi_cxx11_(&local_308,pVVar2,uVar17);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,local_308._M_dataplus._M_p,local_308._M_string_length
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208," has branches to the case construct that targets ",
                         0x31);
              ValidationState_t::getIdName_abi_cxx11_(&local_2c8,pVVar2,_Var7);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,local_2c8._M_dataplus._M_p,local_2c8._M_string_length
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         ", but does not immediately precede it in the OpSwitch\'s target list",0x43
                        );
              local_31c = local_208.error_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p != &local_308.field_2) {
                operator_delete(local_308._M_dataplus._M_p,
                                local_308.field_2._M_allocated_capacity + 1);
              }
              DiagnosticStream::~DiagnosticStream(&local_208);
              iVar19 = 1;
            }
          }
        }
      }
LAB_001c3a0e:
      if ((iVar19 != 10) && (iVar19 != 0)) break;
      uVar11 = (ulong)((int)uVar11 + 2);
      uVar15 = (long)(switch_inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(switch_inst->operands_).
                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      local_314 = local_314 + 2;
      bVar21 = uVar11 < uVar15;
    } while (uVar11 < uVar15);
  }
  if (!bVar21) {
    if ((_Rb_tree_header *)local_2a8._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_2a8._M_impl.super__Rb_tree_header) {
      p_Var16 = local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        pVVar2 = local_310;
        uVar17 = *(uint *)&p_Var16[1].field_0x4;
        if (1 < uVar17) {
          inst = ValidationState_t::FindDef(local_310,p_Var16[1]._M_color);
          ValidationState_t::diag(&local_208,pVVar2,SPV_ERROR_INVALID_CFG,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,
                     "Multiple case constructs have branches to the case construct that targets ",
                     0x4a);
          ValidationState_t::getIdName_abi_cxx11_(&local_308,pVVar2,p_Var16[1]._M_color);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_308._M_dataplus._M_p,local_308._M_string_length);
          local_31c = local_208.error_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != &local_308.field_2) {
            operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
          }
          DiagnosticStream::~DiagnosticStream(&local_208);
        }
        if (1 < uVar17) goto LAB_001c3c98;
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      } while ((_Rb_tree_header *)p_Var16 != &local_2a8._M_impl.super__Rb_tree_header);
    }
    local_31c = SPV_SUCCESS;
  }
LAB_001c3c98:
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_278);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::_M_erase(&local_2a8,(_Link_type)local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_240);
  return local_31c;
}

Assistant:

spv_result_t StructuredSwitchChecks(ValidationState_t& _, Function* function,
                                    const Instruction* switch_inst,
                                    const BasicBlock* header,
                                    const BasicBlock* merge) {
  std::unordered_set<uint32_t> case_targets;
  for (uint32_t i = 1; i < switch_inst->operands().size(); i += 2) {
    uint32_t target = switch_inst->GetOperandAs<uint32_t>(i);
    if (target != merge->id()) case_targets.insert(target);
  }
  // Tracks how many times each case construct is targeted by another case
  // construct.
  std::map<uint32_t, uint32_t> num_fall_through_targeted;
  uint32_t default_case_fall_through = 0u;
  uint32_t default_target = switch_inst->GetOperandAs<uint32_t>(1u);
  bool default_appears_multiple_times = false;
  for (uint32_t i = 3; i < switch_inst->operands().size(); i += 2) {
    if (default_target == switch_inst->GetOperandAs<uint32_t>(i)) {
      default_appears_multiple_times = true;
      break;
    }
  }
  std::unordered_map<uint32_t, uint32_t> seen_to_fall_through;
  for (uint32_t i = 1; i < switch_inst->operands().size(); i += 2) {
    uint32_t target = switch_inst->GetOperandAs<uint32_t>(i);
    if (target == merge->id()) continue;

    uint32_t case_fall_through = 0u;
    auto seen_iter = seen_to_fall_through.find(target);
    if (seen_iter == seen_to_fall_through.end()) {
      const auto target_block = function->GetBlock(target).first;
      // OpSwitch must dominate all its case constructs.
      if (header->structurally_reachable() &&
          target_block->structurally_reachable() &&
          !header->structurally_dominates(*target_block)) {
        return _.diag(SPV_ERROR_INVALID_CFG, header->label())
               << "Switch header " << _.getIdName(header->id())
               << " does not structurally dominate its case construct "
               << _.getIdName(target);
      }

      if (auto error = FindCaseFallThrough(_, target_block, &case_fall_through,
                                           merge, case_targets, function)) {
        return error;
      }

      // Track how many time the fall through case has been targeted.
      if (case_fall_through != 0u) {
        auto where = num_fall_through_targeted.lower_bound(case_fall_through);
        if (where == num_fall_through_targeted.end() ||
            where->first != case_fall_through) {
          num_fall_through_targeted.insert(
              where, std::make_pair(case_fall_through, 1));
        } else {
          where->second++;
        }
      }
      seen_to_fall_through.insert(std::make_pair(target, case_fall_through));
    } else {
      case_fall_through = seen_iter->second;
    }

    if (case_fall_through == default_target &&
        !default_appears_multiple_times) {
      case_fall_through = default_case_fall_through;
    }
    if (case_fall_through != 0u) {
      bool is_default = i == 1;
      if (is_default) {
        default_case_fall_through = case_fall_through;
      } else {
        // Allow code like:
        // case x:
        // case y:
        //   ...
        // case z:
        //
        // Where x and y target the same block and fall through to z.
        uint32_t j = i;
        while ((j + 2 < switch_inst->operands().size()) &&
               target == switch_inst->GetOperandAs<uint32_t>(j + 2)) {
          j += 2;
        }
        // If Target T1 branches to Target T2, or if Target T1 branches to the
        // Default target and the Default target branches to Target T2, then T1
        // must immediately precede T2 in the list of OpSwitch Target operands.
        if ((switch_inst->operands().size() < j + 2) ||
            (case_fall_through != switch_inst->GetOperandAs<uint32_t>(j + 2))) {
          return _.diag(SPV_ERROR_INVALID_CFG, switch_inst)
                 << "Case construct that targets " << _.getIdName(target)
                 << " has branches to the case construct that targets "
                 << _.getIdName(case_fall_through)
                 << ", but does not immediately precede it in the "
                    "OpSwitch's target list";
        }
      }
    }
  }

  // Each case construct must be branched to by at most one other case
  // construct.
  for (const auto& pair : num_fall_through_targeted) {
    if (pair.second > 1) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(pair.first))
             << "Multiple case constructs have branches to the case construct "
                "that targets "
             << _.getIdName(pair.first);
    }
  }

  return SPV_SUCCESS;
}